

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::TimingControl*>::emplace_back<slang::ast::TimingControl*>
          (SmallVectorBase<slang::ast::TimingControl*> *this,TimingControl **args)

{
  long lVar1;
  reference ppTVar2;
  pointer ppTVar3;
  
  lVar1 = *(long *)(this + 8);
  ppTVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppTVar3 = emplaceRealloc<slang::ast::TimingControl*>(this,ppTVar3,args);
    return ppTVar3;
  }
  *ppTVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppTVar2 = SmallVectorBase<slang::ast::TimingControl_*>::back
                      ((SmallVectorBase<slang::ast::TimingControl_*> *)this);
  return ppTVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }